

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_pubkey_ok_ecdsa.c
# Opt level: O2

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  
  iVar1 = test_auth_pubkey(session,0,"libssh2",(char *)0x0,"key_ecdsa.pub","key_ecdsa");
  return iVar1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
#if LIBSSH2_ECDSA
    /* set in Dockerfile */
    return test_auth_pubkey(session, 0,
                            "libssh2",
                            NULL,
                            "key_ecdsa.pub",
                            "key_ecdsa");
#else
    (void)session;
    return 0;
#endif
}